

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_set_voption(cram_fd *fd,cram_option opt,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  t_pool *ptVar6;
  t_results_queue *ptVar7;
  uint *local_228;
  undefined8 *local_210;
  int *local_1f8;
  int *local_1e0;
  undefined8 *local_1c8;
  undefined8 *local_1b0;
  long *local_190;
  long *local_170;
  int *local_158;
  int *local_140;
  int *local_128;
  int *local_110;
  int *local_f8;
  int *local_e0;
  int *local_c8;
  int *local_b0;
  int *local_98;
  kh_refs_t *local_80;
  int *local_68;
  int nthreads;
  char *s;
  int minor;
  int major;
  refs_t *refs;
  __va_list_tag *args_local;
  cram_fd *pcStack_18;
  cram_option opt_local;
  cram_fd *fd_local;
  
  if (fd == (cram_fd *)0x0) {
    return -1;
  }
  refs = (refs_t *)args;
  args_local._4_4_ = opt;
  pcStack_18 = fd;
  switch(opt) {
  case CRAM_OPT_DECODE_MD:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_68 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_68 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_68 + 2;
    }
    fd->decode_md = *local_68;
    break;
  case CRAM_OPT_PREFIX:
    if (fd->prefix != (char *)0x0) {
      free(fd->prefix);
    }
    uVar1 = *(uint *)&refs->pool;
    if (uVar1 < 0x29) {
      local_80 = (kh_refs_t *)((long)(int)uVar1 + (long)refs->ref_id);
      *(uint *)&refs->pool = uVar1 + 8;
    }
    else {
      local_80 = refs->h_meta;
      refs->h_meta = (kh_refs_t *)&local_80->n_occupied;
    }
    pcVar5 = strdup(*(char **)local_80);
    pcStack_18->prefix = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return -1;
    }
    break;
  case CRAM_OPT_VERBOSITY:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_98 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_98 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_98 + 2;
    }
    fd->verbose = *local_98;
    break;
  case CRAM_OPT_SEQS_PER_SLICE:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_b0 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_b0 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_b0 + 2;
    }
    fd->seqs_per_slice = *local_b0;
    break;
  case CRAM_OPT_SLICES_PER_CONTAINER:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_c8 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_c8 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_c8 + 2;
    }
    fd->slices_per_container = *local_c8;
    break;
  case CRAM_OPT_RANGE:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_190 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_190 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_190 + 1;
    }
    puVar2 = (undefined8 *)*local_190;
    uVar3 = *puVar2;
    (fd->range).refid = (int)uVar3;
    (fd->range).start = (int)((ulong)uVar3 >> 0x20);
    (fd->range).end = *(int *)(puVar2 + 1);
    iVar4 = cram_seek_to_refpos(fd,&fd->range);
    return iVar4;
  case CRAM_OPT_VERSION:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_1c8 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_1c8 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_1c8 + 1;
    }
    uVar3 = *local_1c8;
    iVar4 = __isoc99_sscanf(uVar3,"%d.%d",(long)&s + 4,&s);
    if (iVar4 != 2) {
      fprintf(_stderr,"Malformed version string %s\n",uVar3);
      return -1;
    }
    if ((((s._4_4_ != 1) || ((int)s != 0)) && ((s._4_4_ != 2 || (((int)s != 0 && ((int)s != 1))))))
       && ((s._4_4_ != 3 || ((int)s != 0)))) {
      fprintf(_stderr,"Unknown version string; use 1.0, 2.0, 2.1 or 3.0\n");
      return -1;
    }
    pcStack_18->version = s._4_4_ * 0x100 + (int)s;
    if (2 < pcStack_18->version >> 8) {
      pcStack_18->use_rans = 1;
    }
    break;
  case CRAM_OPT_EMBED_REF:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_e0 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_e0 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_e0 + 2;
    }
    fd->embed_ref = *local_e0;
    break;
  case CRAM_OPT_IGNORE_MD5:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_110 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_110 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_110 + 2;
    }
    fd->ignore_md5 = *local_110;
    break;
  case CRAM_OPT_REFERENCE:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_1b0 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_1b0 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_1b0 + 1;
    }
    iVar4 = cram_load_reference(fd,(char *)*local_1b0);
    return iVar4;
  case CRAM_OPT_MULTI_SEQ_PER_SLICE:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_1e0 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_1e0 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_1e0 + 2;
    }
    fd->multi_seq = *local_1e0;
    break;
  case CRAM_OPT_NO_REF:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_f8 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_f8 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_f8 + 2;
    }
    fd->no_ref = *local_f8;
    break;
  case CRAM_OPT_USE_BZIP2:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_128 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_128 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_128 + 2;
    }
    fd->use_bz2 = *local_128;
    break;
  case CRAM_OPT_SHARED_REF:
    fd->shared_ref = 1;
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_170 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_170 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_170 + 1;
    }
    _minor = (refs_t *)*local_170;
    if (_minor != fd->refs) {
      if (fd->refs != (refs_t *)0x0) {
        refs_free(fd->refs);
      }
      pcStack_18->refs = _minor;
      pcStack_18->refs->count = pcStack_18->refs->count + 1;
    }
    break;
  case CRAM_OPT_NTHREADS:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_1f8 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_1f8 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_1f8 + 2;
    }
    iVar4 = *local_1f8;
    if (1 < iVar4) {
      ptVar6 = t_pool_init(iVar4 << 1,iVar4);
      pcStack_18->pool = ptVar6;
      if (ptVar6 == (t_pool *)0x0) {
        return -1;
      }
      ptVar7 = t_results_queue_init();
      pcStack_18->rqueue = ptVar7;
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->metrics_lock,(pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->ref_lock,(pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->bam_list_lock,(pthread_mutexattr_t *)0x0);
      pcStack_18->shared_ref = 1;
      pcStack_18->own_pool = 1;
    }
    break;
  case CRAM_OPT_THREAD_POOL:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_210 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_210 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_210 + 1;
    }
    fd->pool = (t_pool *)*local_210;
    if (fd->pool != (t_pool *)0x0) {
      ptVar7 = t_results_queue_init();
      pcStack_18->rqueue = ptVar7;
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->metrics_lock,(pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->ref_lock,(pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&pcStack_18->bam_list_lock,(pthread_mutexattr_t *)0x0);
    }
    pcStack_18->shared_ref = 1;
    pcStack_18->own_pool = 0;
    break;
  case CRAM_OPT_USE_LZMA:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_158 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_158 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_158 + 2;
    }
    fd->use_lzma = *local_158;
    break;
  case CRAM_OPT_USE_RANS:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_140 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_140 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_140 + 2;
    }
    fd->use_rans = *local_140;
    break;
  case CRAM_OPT_REQUIRED_FIELDS:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_228 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_228 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = local_228 + 2;
    }
    fd->required_fields = *local_228;
    break;
  default:
    fprintf(_stderr,"Unknown CRAM option code %d\n",(ulong)opt);
    return -1;
  }
  return 0;
}

Assistant:

int cram_set_voption(cram_fd *fd, enum cram_option opt, va_list args) {
    refs_t *refs;

    if (!fd)
	return -1;

    switch (opt) {
    case CRAM_OPT_DECODE_MD:
	fd->decode_md = va_arg(args, int);
	break;

    case CRAM_OPT_PREFIX:
	if (fd->prefix)
	    free(fd->prefix);
	if (!(fd->prefix = strdup(va_arg(args, char *))))
	    return -1;
	break;

    case CRAM_OPT_VERBOSITY:
	fd->verbose = va_arg(args, int);
	break;

    case CRAM_OPT_SEQS_PER_SLICE:
	fd->seqs_per_slice = va_arg(args, int);
	break;

    case CRAM_OPT_SLICES_PER_CONTAINER:
	fd->slices_per_container = va_arg(args, int);
	break;

    case CRAM_OPT_EMBED_REF:
	fd->embed_ref = va_arg(args, int);
	break;

    case CRAM_OPT_NO_REF:
	fd->no_ref = va_arg(args, int);
	break;

    case CRAM_OPT_IGNORE_MD5:
	fd->ignore_md5 = va_arg(args, int);
	break;

    case CRAM_OPT_USE_BZIP2:
	fd->use_bz2 = va_arg(args, int);
	break;

    case CRAM_OPT_USE_RANS:
	fd->use_rans = va_arg(args, int);
	break;

    case CRAM_OPT_USE_LZMA:
	fd->use_lzma = va_arg(args, int);
	break;

    case CRAM_OPT_SHARED_REF:
	fd->shared_ref = 1;
	refs = va_arg(args, refs_t *);
	if (refs != fd->refs) {
	    if (fd->refs)
		refs_free(fd->refs);
	    fd->refs = refs;
	    fd->refs->count++;
	}
	break;

    case CRAM_OPT_RANGE:
	fd->range = *va_arg(args, cram_range *);
	return cram_seek_to_refpos(fd, &fd->range);

    case CRAM_OPT_REFERENCE:
	return cram_load_reference(fd, va_arg(args, char *));

    case CRAM_OPT_VERSION: {
	int major, minor;
	char *s = va_arg(args, char *);
	if (2 != sscanf(s, "%d.%d", &major, &minor)) {
	    fprintf(stderr, "Malformed version string %s\n", s);
	    return -1;
	}
	if (!((major == 1 &&  minor == 0) ||
	      (major == 2 && (minor == 0 || minor == 1)) ||
	      (major == 3 &&  minor == 0))) {
	    fprintf(stderr, "Unknown version string; "
		    "use 1.0, 2.0, 2.1 or 3.0\n");
	    return -1;
	}
	fd->version = major*256 + minor;

	if (CRAM_MAJOR_VERS(fd->version) >= 3)
	    fd->use_rans = 1;
	break;
    }

    case CRAM_OPT_MULTI_SEQ_PER_SLICE:
	fd->multi_seq = va_arg(args, int);
	break;

    case CRAM_OPT_NTHREADS: {
	int nthreads =  va_arg(args, int);
        if (nthreads > 1) {
            if (!(fd->pool = t_pool_init(nthreads*2, nthreads)))
                return -1;

	    fd->rqueue = t_results_queue_init();
	    pthread_mutex_init(&fd->metrics_lock, NULL);
	    pthread_mutex_init(&fd->ref_lock, NULL);
	    pthread_mutex_init(&fd->bam_list_lock, NULL);
	    fd->shared_ref = 1;
	    fd->own_pool = 1;
        }
	break;
    }

    case CRAM_OPT_THREAD_POOL:
	fd->pool = va_arg(args, t_pool *);
	if (fd->pool) {
	    fd->rqueue = t_results_queue_init();
	    pthread_mutex_init(&fd->metrics_lock, NULL);
	    pthread_mutex_init(&fd->ref_lock, NULL);
	    pthread_mutex_init(&fd->bam_list_lock, NULL);
	}
	fd->shared_ref = 1; // Needed to avoid clobbering ref between threads
	fd->own_pool = 0;

	//fd->qsize = 1;
	//fd->decoded = calloc(fd->qsize, sizeof(cram_container *));
	//t_pool_dispatch(fd->pool, cram_decoder_thread, fd);
	break;

    case CRAM_OPT_REQUIRED_FIELDS:
	fd->required_fields = va_arg(args, int);
	break;

    default:
	fprintf(stderr, "Unknown CRAM option code %d\n", opt);
	return -1;
    }

    return 0;
}